

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O2

TD * __thiscall HTML::TD::align(TD *this,string *value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->super_TAG).m_stream," align=\'");
  poVar1 = std::operator<<(poVar1,(string *)value);
  std::operator<<(poVar1,"\'");
  return this;
}

Assistant:

TD &align(const std::string &value) {
    m_stream << " align='" << value << "'";
    return *this;
  }